

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O1

int __thiscall
RuntimeObjectSystem::TestBuildAllRuntimeHeaders
          (RuntimeObjectSystem *this,ITestBuildNotifier *callback,bool bTestFileTracking)

{
  ICompilerLogger *pIVar1;
  int iVar2;
  pointer *ppPVar3;
  pointer pPVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  Path *file;
  pointer this_00;
  int unaff_R15D;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  TFileList filesToTest;
  vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> local_68;
  string local_50;
  
  if (callback == (ITestBuildNotifier *)0x0) {
    callback = (ITestBuildNotifier *)this;
  }
  pPVar4 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->m_Projects).
                super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4;
  if (lVar5 == 0) {
    bVar12 = true;
  }
  else {
    uVar6 = (lVar5 >> 3) * -0x7dc11f7047dc11f7;
    ppPVar3 = &(pPVar4->m_RuntimeFileList).
               super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = 1;
    lVar5 = 0;
    do {
      lVar5 = lVar5 + ((long)*ppPVar3 - (long)((_Vector_impl_data *)(ppPVar3 + -1))->_M_start >> 3)
                      * -0x3333333333333333;
      uVar11 = uVar8 & 0xffff;
      ppPVar3 = ppPVar3 + 0x39;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (uVar11 <= uVar6 && uVar6 - uVar11 != 0);
    bVar12 = lVar5 == 0;
  }
  if (bVar12) {
    (*(((RuntimeObjectSystem *)callback)->super_IRuntimeObjectSystem).super_ITestBuildNotifier.
      _vptr_ITestBuildNotifier[2])(callback,0,1);
  }
  pPVar4 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar13 = (this->m_Projects).
           super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
           ._M_impl.super__Vector_impl_data._M_finish == pPVar4;
  bVar12 = !bVar13;
  if (bVar13) {
    iVar9 = 0;
  }
  else {
    uVar6 = 0;
    uVar10 = 0;
    iVar9 = 0;
    do {
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::vector
                (&local_68,&pPVar4[uVar6].m_RuntimeFileList);
      for (this_00 = local_68.
                     super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar13 = this_00 !=
                   local_68.
                   super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                   ._M_impl.super__Vector_impl_data._M_finish, bVar13; this_00 = this_00 + 1) {
        FileSystemUtils::Path::Extension_abi_cxx11_(&local_50,this_00);
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar14 = true;
        if (iVar2 == 0) {
          iVar2 = TestBuildFile(this->m_pCompilerLogger,this,this_00,callback,bTestFileTracking);
          iVar7 = iVar9 - iVar2;
          bVar14 = -1 < iVar2;
          if (!bVar14) {
            iVar2 = 0;
            unaff_R15D = iVar7;
          }
          iVar9 = iVar9 + iVar2;
        }
        if (!bVar14) break;
      }
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector(&local_68)
      ;
      if (bVar13) break;
      uVar10 = uVar10 + 1;
      uVar6 = (ulong)(uVar10 & 0xffff);
      pPVar4 = (this->m_Projects).
               super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->m_Projects).
                     super__Vector_base<RuntimeObjectSystem::ProjectSettings,_std::allocator<RuntimeObjectSystem::ProjectSettings>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 3) *
              -0x7dc11f7047dc11f7;
      bVar13 = uVar8 - uVar6 != 0;
      bVar12 = uVar6 <= uVar8 && bVar13;
    } while (uVar6 <= uVar8 && bVar13);
  }
  if (!bVar12) {
    pIVar1 = this->m_pCompilerLogger;
    unaff_R15D = iVar9;
    if (iVar9 == 0) {
      if (pIVar1 != (ICompilerLogger *)0x0) {
        (**(code **)(*(long *)pIVar1 + 0x10))(pIVar1,"All Tests Passed\n");
      }
    }
    else if (pIVar1 != (ICompilerLogger *)0x0) {
      (*(code *)**(undefined8 **)pIVar1)(pIVar1,"Tests Failed: %d\n",iVar9);
    }
  }
  return unaff_R15D;
}

Assistant:

int RuntimeObjectSystem::TestBuildAllRuntimeHeaders(      ITestBuildNotifier* callback, bool bTestFileTracking )
{
    ITestBuildNotifier* failCallbackLocal = callback;
    if( !failCallbackLocal )
    {
        failCallbackLocal = this;
    }

    int numErrors = 0;

    size_t numFilesToBuild = 0;
    for( unsigned short proj = 0; proj < m_Projects.size( ); ++proj )
    {
        numFilesToBuild += m_Projects[ proj ].m_RuntimeFileList.size( );
    }

    if( 0 == numFilesToBuild )
    {
        failCallbackLocal->TestBuildCallback( NULL, TESTBUILDRRESULT_NO_FILES_TO_BUILD );
    }

    for( unsigned short proj = 0; proj < m_Projects.size(); ++proj )
    {
        TFileList filesToTest = m_Projects[ proj ].m_RuntimeFileList; // m_RuntimeFileList could change if file content changes (new includes or source dependencies) so make copy to ensure iterators valid.
        for( TFileList::iterator it = filesToTest.begin( ); it != filesToTest.end( ); ++it )
        {
            const Path& file = *it;
            if( file.Extension() == ".h" ) // exclude headers, use TestBuildAllRuntimeHeaders
            {
                int fileErrors = TestBuildFile( m_pCompilerLogger, this, file, failCallbackLocal, bTestFileTracking );
                if( fileErrors < 0 )
                {
                    // this means exit, and the number of errors is -ve so remove
                    return numErrors - fileErrors;
                }
                numErrors += fileErrors;
            }
        }
    }

    
    if( 0 == numErrors )
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogInfo("All Tests Passed\n"); }
    }
    else
    {
        if( m_pCompilerLogger ) { m_pCompilerLogger->LogError("Tests Failed: %d\n", numErrors); }
    }
    return numErrors;
}